

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-helpers.c++
# Opt level: O0

bool __thiscall kj::_::expectExit(_ *this,Maybe<int> *statusCode,FunctionParam<void_()> code)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  bool local_e1;
  char *pcStack_e0;
  bool _kj_shouldLog_3;
  bool local_d6;
  bool local_d5;
  int local_d4;
  bool _kj_shouldLog_2;
  uint uStack_d0;
  bool _kj_shouldLog_1;
  DebugExpression<int> local_cc;
  undefined1 local_c8 [8];
  DebugComparison<int,_int> _kjCondition_1;
  uint local_a0;
  DebugExpression<int> DStack_9c;
  bool _kj_shouldLog;
  undefined1 local_98 [8];
  DebugComparison<int,_int_&> _kjCondition;
  int *s;
  int *_s148;
  Fault f_1;
  SyscallResult local_48;
  undefined4 local_44;
  SyscallResult _kjSyscallResult_1;
  int status;
  Fault f;
  SyscallResult local_30;
  undefined1 local_2c [4];
  SyscallResult _kjSyscallResult;
  pid_t child;
  Maybe<int> *statusCode_local;
  FunctionParam<void_()> code_local;
  
  code_local.space._0_8_ = code.space._0_8_;
  f.exception = (Exception *)local_2c;
  __kjSyscallResult = this;
  statusCode_local = statusCode;
  local_30 = Debug::syscall<kj::_::expectExit(kj::Maybe<int>,kj::FunctionParam<void()>)::__0>
                       ((anon_class_8_1_a7bde43c *)&f,false);
  pvVar3 = Debug::SyscallResult::operator_cast_to_void_(&local_30);
  if (pvVar3 == (void *)0x0) {
    iVar2 = Debug::SyscallResult::getErrorNumber(&local_30);
    Debug::Fault::Fault((Fault *)&_kjSyscallResult_1,
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                        ,0x8a,iVar2,"child = fork()","");
    Debug::Fault::fatal((Fault *)&_kjSyscallResult_1);
  }
  if (local_2c != (undefined1  [4])0x0) {
    f_1.exception = (Exception *)local_2c;
    local_48 = Debug::syscall<kj::_::expectExit(kj::Maybe<int>,kj::FunctionParam<void()>)::__1>
                         ((anon_class_16_2_faf9cb4d *)&f_1,false);
    pvVar3 = Debug::SyscallResult::operator_cast_to_void_(&local_48);
    if (pvVar3 == (void *)0x0) {
      iVar2 = Debug::SyscallResult::getErrorNumber(&local_48);
      Debug::Fault::Fault((Fault *)&_s148,
                          "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                          ,0x91,iVar2,"waitpid(child, &status, 0)","");
      Debug::Fault::fatal((Fault *)&_s148);
    }
    if ((local_44 & 0x7f) == 0) {
      _kjCondition._32_8_ = readMaybe<int>((Maybe<int> *)this);
      if ((int *)_kjCondition._32_8_ == (int *)0x0) {
        uStack_d0 = (uint)local_44._1_1_;
        local_cc = DebugExpressionStart::operator<<
                             ((DebugExpressionStart *)&MAGIC_ASSERT,(int *)&stack0xffffffffffffff30)
        ;
        local_d4 = 0;
        DebugExpression<int>::operator!=((DebugComparison<int,_int> *)local_c8,&local_cc,&local_d4);
        bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_c8);
        if (!bVar1) {
          local_d5 = Debug::shouldLog(ERROR);
          while (local_d5 != false) {
            Debug::log<char_const(&)[42],kj::_::DebugComparison<int,int>&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                       ,0x98,ERROR,
                       "\"failed: expected \" \"WEXITSTATUS(status) != 0\", _kjCondition",
                       (char (*) [42])"failed: expected WEXITSTATUS(status) != 0",
                       (DebugComparison<int,_int> *)local_c8);
            local_d5 = false;
          }
        }
        code_local.space[0xf] = (int)(local_44 & 0xff00) >> 8 != 0;
      }
      else {
        local_a0 = (uint)local_44._1_1_;
        DStack_9c = DebugExpressionStart::operator<<
                              ((DebugExpressionStart *)&MAGIC_ASSERT,(int *)&local_a0);
        DebugExpression<int>::operator==
                  ((DebugComparison<int,_int_&> *)local_98,&stack0xffffffffffffff64,
                   (int *)_kjCondition._32_8_);
        bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_98);
        if (!bVar1) {
          _kjCondition_1._31_1_ = Debug::shouldLog(ERROR);
          while (_kjCondition_1._31_1_ != '\0') {
            Debug::log<char_const(&)[42],kj::_::DebugComparison<int,int&>&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                       ,0x95,ERROR,
                       "\"failed: expected \" \"WEXITSTATUS(status) == s\", _kjCondition",
                       (char (*) [42])"failed: expected WEXITSTATUS(status) == s",
                       (DebugComparison<int,_int_&> *)local_98);
            _kjCondition_1._31_1_ = 0;
          }
        }
        code_local.space[0xf] = (int)(local_44 & 0xff00) >> 8 == *(int *)_kjCondition._32_8_;
      }
    }
    else {
      if ((char)(((byte)local_44 & 0x7f) + 1) >> 1 < '\x01') {
        local_e1 = Debug::shouldLog(ERROR);
        while (local_e1 != false) {
          Debug::log<char_const(&)[51],int&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                     ,0x9f,ERROR,"\"subprocess didn\'t exit and didn\'t trigger a signal\", status",
                     (char (*) [51])"subprocess didn\'t exit and didn\'t trigger a signal",&local_44
                    );
          local_e1 = false;
        }
      }
      else {
        local_d6 = Debug::shouldLog(ERROR);
        while (local_d6 != false) {
          pcStack_e0 = strsignal(local_44 & 0x7f);
          Debug::log<char_const(&)[46],char*>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                     ,0x9d,ERROR,
                     "\"subprocess didn\'t exit but triggered a signal\", strsignal(WTERMSIG(status))"
                     ,(char (*) [46])"subprocess didn\'t exit but triggered a signal",
                     &stack0xffffffffffffff20);
          local_d6 = false;
        }
      }
      code_local.space[0xf] = '\0';
    }
    return (bool)code_local.space[0xf];
  }
  FunctionParam<void_()>::operator()((FunctionParam<void_()> *)&statusCode_local);
  _exit(0);
}

Assistant:

bool expectExit(Maybe<int> statusCode, FunctionParam<void()> code)  noexcept {
#if _WIN32
  // We don't support death tests on Windows due to lack of efficient fork.
  return true;
#else
  pid_t child;
  KJ_SYSCALL(child = fork());
  if (child == 0) {
    code();
    _exit(0);
  }

  int status;
  KJ_SYSCALL(waitpid(child, &status, 0));

  if (WIFEXITED(status)) {
    KJ_IF_SOME(s, statusCode) {
      KJ_EXPECT(WEXITSTATUS(status) == s);
      return WEXITSTATUS(status) == s;
    } else {
      KJ_EXPECT(WEXITSTATUS(status) != 0);
      return WEXITSTATUS(status) != 0;
    }
  } else {
    if (WIFSIGNALED(status)) {
      KJ_FAIL_EXPECT("subprocess didn't exit but triggered a signal", strsignal(WTERMSIG(status)));
    } else {
      KJ_FAIL_EXPECT("subprocess didn't exit and didn't trigger a signal", status);
    }
    return false;
  }
#endif
}